

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEIDeriv1_Writer.cpp
# Opt level: O3

void __thiscall OSTEIDeriv1_Writer::WriteAccumulation(OSTEIDeriv1_Writer *this)

{
  QAM *pQVar1;
  pointer pcVar2;
  OSTEI_HRR_Algorithm_Base *this_00;
  ostream *poVar3;
  _Base_ptr p_Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  _Base_ptr p_Var6;
  int iVar7;
  _Alloc_hider _Var8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  int iVar17;
  QAMSet topq;
  string local_1a0;
  OSTEIDeriv1_Writer *local_180;
  undefined1 local_178 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  string local_148;
  string local_128;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  _Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_> local_f8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  
  this_00 = OSTEI_HRR_Writer::Algo((this->super_OSTEI_Writer_Base).hrr_writer_);
  OSTEI_HRR_Algorithm_Base::TopAM((QAMSet *)&local_f8,this_00);
  local_180 = this;
  std::__ostream_insert<char,std::char_traits<char>>((this->super_OSTEI_Writer_Base).os_,"\n\n",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((local_180->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"////////////////////////////////////\n",0x25);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((local_180->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"// Accumulate contracted integrals\n",0x23);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((local_180->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"////////////////////////////////////\n",0x25);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((local_180->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"if(lastoffset == 0)\n",0x14);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((local_180->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_f8._M_impl.super__Rb_tree_header) {
    pcVar2 = local_178 + 0x10;
    p_Var4 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_68 = *(undefined8 *)(p_Var4 + 1);
      uStack_60 = p_Var4[1]._M_parent;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,p_Var4[1]._M_left,
                 (long)&(p_Var4[1]._M_left)->_M_color + (long)&(p_Var4[1]._M_right)->_M_color);
      iVar7 = (int)local_68;
      iVar15 = local_68._4_4_;
      iVar16 = (int)uStack_60;
      iVar17 = uStack_60._4_4_;
      if (local_58[0] != local_48) {
        local_108 = (int)local_68;
        iStack_104 = local_68._4_4_;
        iStack_100 = (int)uStack_60;
        iStack_fc = uStack_60._4_4_;
        operator_delete(local_58[0]);
        iVar7 = local_108;
        iVar15 = iStack_104;
        iVar16 = iStack_100;
        iVar17 = iStack_fc;
      }
      pQVar1 = (QAM *)(p_Var4 + 1);
      auVar9._0_4_ = iVar7 + 2;
      auVar9._4_4_ = iVar15 + 2;
      auVar9._8_4_ = iVar16 + 2;
      auVar9._12_4_ = iVar17 + 2;
      auVar11._4_4_ = iVar15 + 1;
      auVar11._12_4_ = iVar17 + 1;
      auVar11._0_4_ = auVar11._4_4_;
      auVar11._8_4_ = auVar11._12_4_;
      iVar7 = (~(iVar16 >> 0x1f) & (uint)((auVar9._8_8_ & 0xffffffff) * (ulong)(iVar16 + 1)) >> 1) *
              (~(iVar7 >> 0x1f) & (uint)(auVar9._0_4_ * (iVar7 + 1)) >> 1) *
              (~(iVar15 >> 0x1f) & (uint)(auVar11._4_4_ * auVar9._4_4_) >> 1) *
              (~(iVar17 >> 0x1f) & (uint)((auVar11._8_8_ & 0xffffffff) * (ulong)auVar9._12_4_) >> 1)
      ;
      poVar3 = (local_180->super_OSTEI_Writer_Base).os_;
      if (p_Var4[1]._M_right == (_Base_ptr)0x0) {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,indent6_abi_cxx11_._M_dataplus._M_p,
                            indent6_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"contract_all    (",0x11);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        local_178._8_8_ = 4;
        local_178._16_5_ = 0x4d495250;
        local_178._0_8_ = pcVar2;
        ArrVarName(&local_1a0,pQVar1,(string *)local_178);
        if ((pointer)local_178._0_8_ != pcVar2) {
          operator_delete((void *)local_178._0_8_);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        local_178._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x5254505f4d495250;
        local_178._8_8_ = 8;
        local_178[0x18] = '\0';
        local_178._0_8_ = pcVar2;
        ArrVarName(&local_148,pQVar1,(string *)local_178);
        if ((pointer)local_178._0_8_ != pcVar2) {
          operator_delete((void *)local_178._0_8_);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_148._M_dataplus._M_p,local_148._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,");\n",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        paVar5 = &local_1a0.field_2;
        _Var8._M_p = local_1a0._M_dataplus._M_p;
      }
      else {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,indent6_abi_cxx11_._M_dataplus._M_p,
                            indent6_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"contract_all_fac(",0x11);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", cfac_",7);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)p_Var4[1]._M_left,(long)p_Var4[1]._M_right);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        QAM::notag((QAM *)local_178,pQVar1);
        local_1a0._M_string_length = 4;
        local_1a0.field_2._M_allocated_capacity._0_5_ = 0x4d495250;
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        ArrVarName(&local_148,(QAM *)local_178,&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_148._M_dataplus._M_p,local_148._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        local_1a0.field_2._M_allocated_capacity = 0x5254505f4d495250;
        local_1a0._M_string_length = 8;
        local_1a0.field_2._M_local_buf[8] = '\0';
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        ArrVarName(&local_128,pQVar1,&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_128._M_dataplus._M_p,local_128._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,");\n",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        paVar5 = &local_158;
        _Var8._M_p = (pointer)local_178._16_8_;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var8._M_p != paVar5) {
        operator_delete(_Var8._M_p);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &local_f8._M_impl.super__Rb_tree_header);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((local_180->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((local_180->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"else\n",5);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((local_180->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"{\n",2);
  p_Var4 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_f8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_f8._M_impl.super__Rb_tree_header) {
    pcVar2 = local_178 + 0x10;
    p_Var6 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_98 = *(undefined8 *)(p_Var6 + 1);
      uStack_90 = p_Var6[1]._M_parent;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,p_Var6[1]._M_left,
                 (long)&(p_Var6[1]._M_left)->_M_color + (long)&(p_Var6[1]._M_right)->_M_color);
      iVar7 = (int)local_98;
      iVar15 = local_98._4_4_;
      iVar16 = (int)uStack_90;
      iVar17 = uStack_90._4_4_;
      if (local_88[0] != local_78) {
        local_108 = (int)local_98;
        iStack_104 = local_98._4_4_;
        iStack_100 = (int)uStack_90;
        iStack_fc = uStack_90._4_4_;
        operator_delete(local_88[0]);
        iVar7 = local_108;
        iVar15 = iStack_104;
        iVar16 = iStack_100;
        iVar17 = iStack_fc;
      }
      pQVar1 = (QAM *)(p_Var6 + 1);
      auVar10._0_4_ = iVar7 + 2;
      auVar10._4_4_ = iVar15 + 2;
      auVar10._8_4_ = iVar16 + 2;
      auVar10._12_4_ = iVar17 + 2;
      auVar12._4_4_ = iVar15 + 1;
      auVar12._12_4_ = iVar17 + 1;
      auVar12._0_4_ = auVar12._4_4_;
      auVar12._8_4_ = auVar12._12_4_;
      iVar7 = (~(iVar16 >> 0x1f) & (uint)((auVar10._8_8_ & 0xffffffff) * (ulong)(iVar16 + 1)) >> 1)
              * (~(iVar7 >> 0x1f) & (uint)(auVar10._0_4_ * (iVar7 + 1)) >> 1) *
              (~(iVar15 >> 0x1f) & (uint)(auVar12._4_4_ * auVar10._4_4_) >> 1) *
              (~(iVar17 >> 0x1f) & (uint)((auVar12._8_8_ & 0xffffffff) * (ulong)auVar10._12_4_) >> 1
              );
      poVar3 = (local_180->super_OSTEI_Writer_Base).os_;
      if (p_Var6[1]._M_right == (_Base_ptr)0x0) {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,indent6_abi_cxx11_._M_dataplus._M_p,
                            indent6_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"contract    (",0xd);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", shelloffsets, ",0x10);
        local_178._8_8_ = 4;
        local_178._16_5_ = 0x4d495250;
        local_178._0_8_ = pcVar2;
        ArrVarName(&local_1a0,pQVar1,(string *)local_178);
        if ((pointer)local_178._0_8_ != pcVar2) {
          operator_delete((void *)local_178._0_8_);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        local_178._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x5254505f4d495250;
        local_178._8_8_ = 8;
        local_178[0x18] = '\0';
        local_178._0_8_ = pcVar2;
        ArrVarName(&local_148,pQVar1,(string *)local_178);
        if ((pointer)local_178._0_8_ != pcVar2) {
          operator_delete((void *)local_178._0_8_);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_148._M_dataplus._M_p,local_148._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,");\n",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        paVar5 = &local_1a0.field_2;
        _Var8._M_p = local_1a0._M_dataplus._M_p;
      }
      else {
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,indent6_abi_cxx11_._M_dataplus._M_p,
                            indent6_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"contract_fac(",0xd);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", cfac_",7);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(char *)p_Var6[1]._M_left,(long)p_Var6[1]._M_right);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", shelloffsets, ",0x10);
        QAM::notag((QAM *)local_178,pQVar1);
        local_1a0._M_string_length = 4;
        local_1a0.field_2._M_allocated_capacity._0_5_ = 0x4d495250;
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        ArrVarName(&local_148,(QAM *)local_178,&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_148._M_dataplus._M_p,local_148._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        local_1a0.field_2._M_allocated_capacity = 0x5254505f4d495250;
        local_1a0._M_string_length = 8;
        local_1a0.field_2._M_local_buf[8] = '\0';
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        ArrVarName(&local_128,pQVar1,&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p);
        }
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_128._M_dataplus._M_p,local_128._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,");\n",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        paVar5 = &local_158;
        _Var8._M_p = (pointer)local_178._16_8_;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var8._M_p != paVar5) {
        operator_delete(_Var8._M_p);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
      p_Var4 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
    } while ((_Rb_tree_header *)p_Var6 != &local_f8._M_impl.super__Rb_tree_header);
  }
  if ((_Rb_tree_header *)p_Var4 != &local_f8._M_impl.super__Rb_tree_header) {
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((local_180->super_OSTEI_Writer_Base).os_,
                          indent6_abi_cxx11_._M_dataplus._M_p,indent6_abi_cxx11_._M_string_length);
      local_178._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x5254505f4d495250;
      local_178._8_8_ = 8;
      local_178[0x18] = '\0';
      local_178._0_8_ = local_178 + 0x10;
      ArrVarName(&local_1a0,(QAM *)(p_Var4 + 1),(string *)local_178);
      if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
        operator_delete((void *)local_178._0_8_);
      }
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_1a0._M_dataplus._M_p,local_1a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," += lastoffset*",0xf);
      local_c8 = *(undefined8 *)(((QAM *)(p_Var4 + 1))->qam)._M_elems;
      uStack_c0 = p_Var4[1]._M_parent;
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b8,p_Var4[1]._M_left,
                 (long)&(p_Var4[1]._M_left)->_M_color + (long)&(p_Var4[1]._M_right)->_M_color);
      auVar13._0_4_ = (int)local_c8 + 2;
      auVar13._4_4_ = local_c8._4_4_ + 2;
      auVar13._8_4_ = (int)uStack_c0 + 2;
      auVar13._12_4_ = uStack_c0._4_4_ + 2;
      auVar14._4_4_ = local_c8._4_4_ + 1;
      auVar14._12_4_ = uStack_c0._4_4_ + 1;
      auVar14._0_4_ = auVar14._4_4_;
      auVar14._8_4_ = auVar14._12_4_;
      poVar3 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar3,
                          (~((int)uStack_c0 >> 0x1f) &
                          (uint)((auVar13._8_8_ & 0xffffffff) * (ulong)((int)uStack_c0 + 1)) >> 1) *
                          (~((int)local_c8 >> 0x1f) &
                          (uint)(auVar13._0_4_ * ((int)local_c8 + 1)) >> 1) *
                          (~(local_c8._4_4_ >> 0x1f) & (uint)(auVar14._4_4_ * auVar13._4_4_) >> 1) *
                          (~(uStack_c0._4_4_ >> 0x1f) &
                          (uint)((auVar14._8_8_ & 0xffffffff) * (ulong)auVar13._12_4_) >> 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";\n",2);
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &local_f8._M_impl.super__Rb_tree_header);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((local_180->super_OSTEI_Writer_Base).os_,indent5_abi_cxx11_._M_dataplus._M_p,
                      indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}\n",2);
  std::_Rb_tree<QAM,_QAM,_std::_Identity<QAM>,_std::less<QAM>,_std::allocator<QAM>_>::~_Rb_tree
            (&local_f8);
  return;
}

Assistant:

void OSTEIDeriv1_Writer::WriteAccumulation(void) const
{
    const auto topq = hrr_writer_.Algo().TopAM();

    os_ << "\n\n";
    os_ << indent5 << "////////////////////////////////////\n";
    os_ << indent5 << "// Accumulate contracted integrals\n";
    os_ << indent5 << "////////////////////////////////////\n";

    os_ << indent5 << "if(lastoffset == 0)\n";
    os_ << indent5 << "{\n";

    for(const auto &it : topq)
    {
        int ncart = NCART(it);
        if(it.tag.size())
            os_ << indent6 << "contract_all_fac(" << ncart << ", cfac_" << it.tag << ", "
                           << PrimVarName(it.notag()) << ", " << PrimPtrName(it) << ");\n";
        else
            os_ << indent6 << "contract_all    (" << ncart << ", " << PrimVarName(it)
                           << ", " << PrimPtrName(it) << ");\n";
    }
    os_ << indent5 << "}\n";
    os_ << indent5 << "else\n";
    os_ << indent5 << "{\n";

    for(const auto &it : topq)
    {
        int ncart = NCART(it);
        if(it.tag.size())
            os_ << indent6 << "contract_fac(" << ncart << ", cfac_" << it.tag << ", shelloffsets, "
                           << PrimVarName(it.notag()) << ", " << PrimPtrName(it) << ");\n";
        else
            os_ << indent6 << "contract    (" << ncart << ", shelloffsets, " << PrimVarName(it)
                           << ", " << PrimPtrName(it) << ");\n";
    }

    for(const auto &it : topq)
        os_ << indent6 << PrimPtrName(it) << " += lastoffset*" << NCART(it) << ";\n";

    os_ << indent5 << "}\n";
}